

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test *this)

{
  BorderAgent *pBVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  _Alloc_hider _Var4;
  Status SVar5;
  int iVar6;
  char *in_R9;
  char *pcVar7;
  string sVar8;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator_type local_4e9;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [32];
  BorderRouterId newId;
  NetworkId local_4a4;
  BorderRouterId local_4a0;
  uchar local_49a [2];
  string local_498;
  internal local_478 [8];
  undefined8 *local_470;
  string local_468;
  ByteArray local_448;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  State local_3ac;
  State local_3a8;
  State local_3a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  UnixTime local_388;
  UnixTime local_380;
  UnixTime local_378;
  BorderAgent local_370;
  PersistentStorageJson psj;
  BorderRouter returnValue;
  
  unlink("./tmp/test.tmp");
  pBVar1 = &returnValue.mAgent;
  returnValue._vptr_BorderRouter = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&returnValue,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)&returnValue);
  if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
    operator_delete(returnValue._vptr_BorderRouter);
  }
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  local_370._vptr_BorderAgent._0_1_ = SVar5 == kSuccess;
  local_370.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)local_370._vptr_BorderAgent._0_1_) {
    testing::Message::Message((Message *)local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&local_370,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x182,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c8,(Message *)local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_4e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_4e8._0_8_ + 8))();
    }
    _Var4._M_p = local_370.mAddr._M_dataplus._M_p;
    if (local_370.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*local_370.mAddr._M_dataplus._M_p != local_370.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*local_370.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&newId);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  local_4e8._0_8_ = (long)local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"1.1.1.2","");
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8._0_8_ = local_4c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"th1.x","");
  ot::commissioner::BorderAgent::State::State(&local_3a4,1,0,1,0,1);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"NetworkId","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"vendor_name","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"model_name","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vendor_data","");
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l._M_len = 2;
  __l._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3a0,__l,&local_4e9);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Domain_name","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430);
  ot::commissioner::UnixTime::UnixTime(&local_378,0);
  pcVar7 = (char *)(ulong)(uint)local_3a4;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_370,(string *)local_4e8,0xb,&local_448,(string *)local_4c8,local_3a4,&local_498,
             0x1011223344556677,&local_468,&local_3d0,(Timestamp)0x0,1,&local_3f0,&local_3a0,
             &local_410,'\0',0,&local_430,local_378,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,&local_370);
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  local_478[0] = (internal)(SVar5 == kSuccess);
  local_470 = (undefined8 *)0x0;
  pBVar1 = &returnValue.mAgent;
  returnValue._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(pBVar1);
  ot::commissioner::BorderAgent::~BorderAgent(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if (local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4e8 + 0x10))
  {
    operator_delete((void *)local_4e8._0_8_);
  }
  if (local_478[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,local_478,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.2\", 11, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18b,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                     local_370._vptr_BorderAgent._0_1_) + 8))();
    }
  }
  puVar3 = local_470;
  if (local_470 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_470 != local_470 + 2) {
      operator_delete((undefined8 *)*local_470);
    }
    operator_delete(puVar3);
  }
  local_370._vptr_BorderAgent._0_1_ = newId.mId == 0;
  local_370.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)local_370._vptr_BorderAgent._0_1_) {
    testing::Message::Message((Message *)local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&local_370,(AssertionResult *)"newId.mId == 0",
               "false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18c,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c8,(Message *)local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4e8._0_8_ + 8))();
    }
    _Var4._M_p = local_370.mAddr._M_dataplus._M_p;
    if (local_370.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*local_370.mAddr._M_dataplus._M_p != local_370.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*local_370.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  local_4e8._0_8_ = (long)local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"1.1.1.3","");
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8._0_8_ = local_4c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"th1.x","");
  ot::commissioner::BorderAgent::State::State(&local_3a8,1,0,1,0,1);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"NetworkId","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"vendor_name","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"model_name","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vendor_data","");
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l_00._M_len = 2;
  __l_00._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3a0,__l_00,&local_4e9);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Domain_name","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430);
  ot::commissioner::UnixTime::UnixTime(&local_380,0);
  pcVar7 = (char *)(ulong)(uint)local_3a8;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_370,(string *)local_4e8,0xc,&local_448,(string *)local_4c8,local_3a8,&local_498,
             0x1011223344556677,&local_468,&local_3d0,(Timestamp)0x0,1,&local_3f0,&local_3a0,
             &local_410,'\0',0,&local_430,local_380,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,&local_370);
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  local_478[0] = (internal)(SVar5 == kSuccess);
  local_470 = (undefined8 *)0x0;
  pBVar1 = &returnValue.mAgent;
  returnValue._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(pBVar1);
  ot::commissioner::BorderAgent::~BorderAgent(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if (local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4e8 + 0x10))
  {
    operator_delete((void *)local_4e8._0_8_);
  }
  if (local_478[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,local_478,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.3\", 12, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x192,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                     local_370._vptr_BorderAgent._0_1_) + 8))();
    }
  }
  puVar3 = local_470;
  if (local_470 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_470 != local_470 + 2) {
      operator_delete((undefined8 *)*local_470);
    }
    operator_delete(puVar3);
  }
  local_370._vptr_BorderAgent._0_1_ = newId.mId == 1;
  local_370.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)local_370._vptr_BorderAgent._0_1_) {
    testing::Message::Message((Message *)local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&local_370,(AssertionResult *)"newId.mId == 1",
               "false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x193,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c8,(Message *)local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4e8._0_8_ + 8))();
    }
    _Var4._M_p = local_370.mAddr._M_dataplus._M_p;
    if (local_370.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*local_370.mAddr._M_dataplus._M_p != local_370.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*local_370.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  local_4e8._0_8_ = (long)local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"1.1.1.4","");
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8._0_8_ = local_4c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"th1.x","");
  ot::commissioner::BorderAgent::State::State(&local_3ac,1,0,1,0,1);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"NetworkId","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"vendor_name","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"model_name","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vendor_data","");
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l_01._M_len = 2;
  __l_01._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3a0,__l_01,&local_4e9);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Domain_name","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430);
  ot::commissioner::UnixTime::UnixTime(&local_388,0);
  pcVar7 = (char *)(ulong)(uint)local_3ac;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_370,(string *)local_4e8,0xd,&local_448,(string *)local_4c8,local_3ac,&local_498,
             0x1011223344556677,&local_468,&local_3d0,(Timestamp)0x0,1,&local_3f0,&local_3a0,
             &local_410,'\0',0,&local_430,local_388,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,&local_370);
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  local_478[0] = (internal)(SVar5 == kSuccess);
  local_470 = (undefined8 *)0x0;
  pBVar1 = &returnValue.mAgent;
  returnValue._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(pBVar1);
  ot::commissioner::BorderAgent::~BorderAgent(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if (local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4e8 + 0x10))
  {
    operator_delete((void *)local_4e8._0_8_);
  }
  if (local_478[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,local_478,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.4\", 13, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x199,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                     local_370._vptr_BorderAgent._0_1_) + 8))();
    }
  }
  puVar3 = local_470;
  if (local_470 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_470 != local_470 + 2) {
      operator_delete((undefined8 *)*local_470);
    }
    operator_delete(puVar3);
  }
  local_370._vptr_BorderAgent._0_1_ = newId.mId == 2;
  local_370.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)local_370._vptr_BorderAgent._0_1_) {
    testing::Message::Message((Message *)local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&local_370,(AssertionResult *)"newId.mId == 2",
               "false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19a,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c8,(Message *)local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c8);
    if ((BorderAgent *)returnValue._vptr_BorderRouter != pBVar1) {
      operator_delete(returnValue._vptr_BorderRouter);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4e8._0_8_ + 8))();
    }
    _Var4._M_p = local_370.mAddr._M_dataplus._M_p;
    if (local_370.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*local_370.mAddr._M_dataplus._M_p != local_370.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*local_370.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&returnValue);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)&local_370,3);
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&local_370,&returnValue);
  sVar8 = (string)(SVar5 == kNotFound);
  local_4e8._8_8_ = (undefined8 *)0x0;
  local_4e8[0] = sVar8;
  if (!(bool)sVar8) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)
               "psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound",
               "false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19e,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)&local_370,1);
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&local_370,&returnValue);
  local_4e8[0] = (string)(SVar5 == kSuccess);
  local_4e8._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_4e8[0]) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)
               "psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess",
               "false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19f,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  local_4e8[0] = (string)(returnValue.mId.mId == 1);
  local_4e8._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_4e8[0]) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)"returnValue.mId.mId == 1","false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a0,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  local_4e8[0] = (string)(returnValue.mAgent.mPort == 0xc);
  local_4e8._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_4e8[0]) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)"returnValue.mAgent.mPort == 12","false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a1,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  iVar6 = std::__cxx11::string::compare((char *)&returnValue.mAgent.mAddr);
  local_4e8[0] = (string)(iVar6 == 0);
  local_4e8._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_4e8[0]) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)"returnValue.mAgent.mAddr == \"1.1.1.3\"","false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a2,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  SVar5 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  local_4e8[0] = (string)(SVar5 == kSuccess);
  local_4e8._8_8_ = (undefined8 *)0x0;
  if (SVar5 != kSuccess) {
    testing::Message::Message((Message *)local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_370,(internal *)local_4e8,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a4,(char *)CONCAT71(local_370._vptr_BorderAgent._1_7_,
                                       local_370._vptr_BorderAgent._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    if ((size_type *)CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_)
        != &local_370.mAddr._M_string_length) {
      operator_delete((undefined1 *)
                      CONCAT71(local_370._vptr_BorderAgent._1_7_,local_370._vptr_BorderAgent._0_1_))
      ;
    }
    if ((AssertHelperData *)local_4c8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_4c8._0_8_ + 8))();
    }
    uVar2 = local_4e8._8_8_;
    if ((undefined8 *)local_4e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_4e8._8_8_ != (undefined8 *)(local_4e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_4e8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  returnValue._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&returnValue.mAgent);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetBorderRouterNotEmpty)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    BorderRouterId newId;

    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.2", 11, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.3", 12, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.4", 13, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    BorderRouter returnValue;

    EXPECT_TRUE(psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAgent.mPort == 12);
    EXPECT_TRUE(returnValue.mAgent.mAddr == "1.1.1.3");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}